

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

nn_trie_node ** nn_node_next(nn_trie_node *self,uint8_t c)

{
  nn_trie_node **ppnVar1;
  byte in_SIL;
  nn_trie_node *in_RDI;
  int i;
  uint local_18;
  nn_trie_node **local_8;
  
  if (in_RDI->type == '\0') {
    local_8 = (nn_trie_node **)0x0;
  }
  else if (in_RDI->type < 9) {
    for (local_18 = 0; local_18 != in_RDI->type; local_18 = local_18 + 1) {
      if (in_RDI->prefix[(long)(int)local_18 + 10] == in_SIL) {
        ppnVar1 = nn_node_child(in_RDI,local_18);
        return ppnVar1;
      }
    }
    local_8 = (nn_trie_node **)0x0;
  }
  else if ((in_SIL < (in_RDI->u).sparse.children[0]) || ((in_RDI->u).sparse.children[1] < in_SIL)) {
    local_8 = (nn_trie_node **)0x0;
  }
  else {
    local_8 = nn_node_child(in_RDI,(uint)in_SIL - (uint)(in_RDI->u).sparse.children[0]);
  }
  return local_8;
}

Assistant:

struct nn_trie_node **nn_node_next (struct nn_trie_node *self, uint8_t c)
{
    /*  Finds the pointer to the next node based on the supplied character.
        If there is no such pointer, it returns NULL. */

    int i;

    if (self->type == 0)
        return NULL;

    /*  Sparse mode. */
    if (self->type <= 8) {
        for (i = 0; i != self->type; ++i)
            if (self->u.sparse.children [i] == c)
                return nn_node_child (self, i);
        return NULL;
    }

    /*  Dense mode. */
    if (c < self->u.dense.min || c > self->u.dense.max)
        return NULL;
    return nn_node_child (self, c - self->u.dense.min);
}